

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

Float __thiscall
pbrt::MeasuredBxDF::PDF
          (MeasuredBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  Vector2f sample_00;
  bool bVar2;
  int iVar3;
  float *pfVar4;
  BxDFReflTransFlags in_EDX;
  long *in_RDI;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 extraout_var [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  float in_XMM1_Da;
  undefined1 in_XMM2 [16];
  undefined4 in_XMM3_Da;
  Vector3<float> VVar17;
  PLSample PVar18;
  Float jacobian;
  Float sinTheta_m;
  Float pdf;
  Float vndfPDF;
  Vector2f sample;
  PLSample ui;
  Float params [2];
  Vector2f u_wm;
  Float phi_m;
  Float theta_m;
  Float phi_i;
  Float theta_i;
  Vector3f wm;
  float in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  float in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  uint uStack_e4;
  Tuple3<pbrt::Vector3,_float> local_9c;
  undefined8 local_90;
  float local_88;
  undefined4 in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  Tuple2<pbrt::Vector2,_float> in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffd0;
  float fStack_28;
  Tuple2<pbrt::Vector2,_float> local_10;
  float local_8;
  float local_4;
  
  local_10 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  uVar1 = vmovlpd_avx(in_XMM2);
  fVar8 = (float)uVar1;
  fStack_28 = (float)((ulong)uVar1 >> 0x20);
  fVar7 = fStack_28;
  fVar6 = fVar8;
  local_8 = in_XMM1_Da;
  iVar3 = operator&(in_EDX,Reflection);
  if (iVar3 == 0) {
    local_4 = 0.0;
  }
  else {
    bVar2 = SameHemisphere((Vector3f *)&local_10,(Vector3f *)&stack0xffffffffffffffd4);
    if (bVar2) {
      auVar16 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
      if (local_8 < 0.0) {
        VVar17 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffea0);
        local_8 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar11._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar11._8_56_ = auVar16;
        in_stack_ffffffffffffff90 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(auVar11._0_16_);
        local_10 = in_stack_ffffffffffffff90;
        VVar17 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffea0);
        local_88 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar12._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar12._8_56_ = auVar16;
        local_90 = vmovlpd_avx(auVar12._0_16_);
        in_stack_ffffffffffffff84 = (float)local_90;
        in_stack_ffffffffffffff88 = (float)((ulong)local_90 >> 0x20);
        in_stack_ffffffffffffff8c = local_88;
        fVar6 = in_stack_ffffffffffffff84;
        fStack_28 = in_stack_ffffffffffffff88;
      }
      VVar17 = Tuple3<pbrt::Vector3,float>::operator+
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          (Vector3<float> *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      local_9c.z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar16;
      local_9c._0_8_ = vmovlpd_avx(auVar13._0_16_);
      fVar5 = LengthSquared<float>((Vector3<float> *)&local_9c);
      if ((fVar5 != 0.0) || (NAN(fVar5))) {
        auVar16 = extraout_var;
        VVar17 = Normalize<float>((Vector3<float> *)
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        local_9c.z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar14._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar14._8_56_ = auVar16;
        local_9c._0_8_ = vmovlpd_avx(auVar14._0_16_);
        SphericalTheta((Vector3f *)0x715d3e);
        dVar9 = std::atan2((double)(ulong)(uint)fStack_28,(double)(ulong)(uint)fVar6);
        SphericalTheta((Vector3f *)0x715d74);
        dVar10 = std::atan2((double)((ulong)local_9c._0_8_ >> 0x20),
                            (double)(local_9c._0_8_ & 0xffffffff));
        fVar5 = SUB84(dVar10,0);
        theta2u(0.0);
        if ((*(byte *)(*in_RDI + 0x350) & 1) != 0) {
          fVar5 = fVar5 - SUB84(dVar9,0);
        }
        phi2u(fVar5);
        Vector2<float>::Vector2
                  ((Vector2<float> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                   in_stack_fffffffffffffe98);
        std::floor((double)(ulong)uStack_e4);
        auVar16 = ZEXT856(0);
        sample_00.super_Tuple2<pbrt::Vector2,_float>.y = fVar6;
        sample_00.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_ffffffffffffffd0;
        PVar18 = PiecewiseLinear2D<2UL>::Invert
                           ((PiecewiseLinear2D<2UL> *)CONCAT44(in_XMM3_Da,fVar7),sample_00,
                            (Float *)CONCAT44(fVar8,in_stack_ffffffffffffffc0));
        auVar15._0_8_ = PVar18.p.super_Tuple2<pbrt::Vector2,_float>;
        auVar15._8_56_ = auVar16;
        vmovlpd_avx(auVar15._0_16_);
        fVar6 = PiecewiseLinear2D<2UL>::Evaluate
                          ((PiecewiseLinear2D<2UL> *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           (Vector2f)in_stack_ffffffffffffff90,
                           (Float *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        fVar7 = Sqr<float>(local_9c.x);
        fVar8 = Sqr<float>(local_9c.y);
        std::sqrt((double)(ulong)(uint)(fVar7 + fVar8));
        fVar7 = Dot<float>((Vector3<float> *)&stack0xffffffffffffffd4,(Vector3<float> *)&local_9c);
        fVar7 = fVar7 * 4.0;
        Sqr<float>(3.1415927);
        pfVar4 = std::max<float>((float *)&stack0xfffffffffffffec4,(float *)&stack0xfffffffffffffec0
                                );
        local_4 = (PVar18.pdf * fVar6) / (fVar7 * *pfVar4);
      }
      else {
        local_4 = 0.0;
      }
    }
    else {
      local_4 = 0.0;
    }
  }
  return local_4;
}

Assistant:

Float MeasuredBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                        BxDFReflTransFlags sampleFlags) const {
    if (!(sampleFlags & BxDFReflTransFlags::Reflection))
        return 0;
    if (!SameHemisphere(wo, wi))
        return 0;
    if (wo.z < 0) {
        wo = -wo;
        wi = -wi;
    }

    Vector3f wm = wi + wo;
    if (LengthSquared(wm) == 0)
        return 0;
    wm = Normalize(wm);

    /* Cartesian -> spherical coordinates */
    Float theta_i = SphericalTheta(wi), phi_i = std::atan2(wi.y, wi.x);
    Float theta_m = SphericalTheta(wm), phi_m = std::atan2(wm.y, wm.x);

    /* Spherical coordinates -> unit coordinate system */
    Vector2f u_wm(theta2u(theta_m), phi2u(brdf->isotropic ? (phi_m - phi_i) : phi_m));
    u_wm.y = u_wm.y - std::floor(u_wm.y);

    Float params[2] = {phi_i, theta_i};
    auto ui = brdf->vndf.Invert(u_wm, params);
    Vector2f sample = ui.p;
    Float vndfPDF = ui.pdf;

    Float pdf = brdf->luminance.Evaluate(sample, params);
    Float sinTheta_m = std::sqrt(Sqr(wm.x) + Sqr(wm.y));
    Float jacobian =
        4.f * Dot(wi, wm) * std::max<Float>(2 * Sqr(Pi) * u_wm.x * sinTheta_m, 1e-6f);
    return vndfPDF * pdf / jacobian;
}